

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::Swap
          (CodeGeneratorRequest *this,CodeGeneratorRequest *other)

{
  CodeGeneratorRequest *other_local;
  CodeGeneratorRequest *this_local;
  
  if (other != this) {
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Swap(&this->file_to_generate_,&other->file_to_generate_);
    std::swap<std::__cxx11::string*>(&this->parameter_,&other->parameter_);
    RepeatedPtrField<google::protobuf::FileDescriptorProto>::Swap
              (&this->proto_file_,&other->proto_file_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void CodeGeneratorRequest::Swap(CodeGeneratorRequest* other) {
  if (other != this) {
    file_to_generate_.Swap(&other->file_to_generate_);
    std::swap(parameter_, other->parameter_);
    proto_file_.Swap(&other->proto_file_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}